

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_Item::next(Fl_Menu_Item *this,int n)

{
  int iVar1;
  int iVar2;
  
  if (n < 0) {
    return (Fl_Menu_Item *)0x0;
  }
  iVar2 = n + (uint)(((uint)this->flags >> 4 & 1) != 0);
  do {
    if (iVar2 == 0) {
      return this;
    }
    iVar1 = 0;
    do {
      if (this->text == (char *)0x0) {
        if (iVar1 == 0) break;
        iVar1 = iVar1 + -1;
      }
      else {
        iVar1 = iVar1 + (uint)(((uint)this->flags >> 6 & 1) != 0);
      }
      this = this + 1;
    } while (iVar1 != 0);
    if (((this->flags & 0x10) == 0) || (this->text == (char *)0x0)) {
      iVar2 = iVar2 + -1;
    }
  } while( true );
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::next(int n) const {
  if (n < 0) return 0; // this is so selected==-1 returns NULL
  const Fl_Menu_Item* m = this;
  if (!m->visible()) n++;
  while (n) {
    m = next_visible_or_not(m);
    if (m->visible() || !m->text) n--;
  }
  return m;
}